

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

Statements * __thiscall Parser::fileInput(Parser *this)

{
  pointer pcVar1;
  int iVar2;
  Statements *this_00;
  Statement *statement;
  Token tok;
  undefined1 local_110 [32];
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  bool local_d0;
  bool bStack_cf;
  bool bStack_ce;
  bool bStack_cd;
  bool bStack_cc;
  bool bStack_cb;
  char cStack_ca;
  undefined1 uStack_c9;
  double dStack_c8;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [32];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  bool local_60;
  bool bStack_5f;
  bool bStack_5e;
  bool bStack_5d;
  bool bStack_5c;
  bool bStack_5b;
  char cStack_5a;
  undefined1 uStack_59;
  double dStack_58;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = (Statements *)operator_new(0x20);
  Statements::Statements(this_00);
  Tokenizer::getToken((Token *)local_a0,this->tokenizer);
  if (local_60 == false) {
    pcVar1 = local_110 + 0x10;
    do {
      if (bStack_5f == true) {
        do {
          Tokenizer::getToken((Token *)local_110,this->tokenizer);
          std::__cxx11::string::operator=((string *)local_a0,(string *)local_110);
          std::__cxx11::string::operator=((string *)&local_80,(string *)&local_f0);
          local_60 = local_d0;
          bStack_5f = bStack_cf;
          bStack_5e = bStack_ce;
          bStack_5d = bStack_cd;
          bStack_5c = bStack_cc;
          bStack_5b = bStack_cb;
          cStack_5a = cStack_ca;
          uStack_59 = uStack_c9;
          dStack_58 = dStack_c8;
          std::__cxx11::string::operator=((string *)&local_50,(string *)&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_p != &local_b0) {
            operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_p != &local_e0) {
            operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
          }
          if ((pointer)local_110._0_8_ != pcVar1) {
            operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
          }
        } while (bStack_5f != false);
      }
      Tokenizer::ungetToken(this->tokenizer);
      statement = stmt(this);
      iVar2 = std::__cxx11::string::compare((char *)local_a0);
      if (iVar2 == 0) {
        statement->isFunction = true;
      }
      Statements::addStatement(this_00,statement);
      Tokenizer::getToken((Token *)local_110,this->tokenizer);
      std::__cxx11::string::operator=((string *)local_a0,(string *)local_110);
      std::__cxx11::string::operator=((string *)&local_80,(string *)&local_f0);
      local_60 = local_d0;
      bStack_5f = bStack_cf;
      bStack_5e = bStack_ce;
      bStack_5d = bStack_cd;
      bStack_5c = bStack_cc;
      bStack_5b = bStack_cb;
      cStack_5a = cStack_ca;
      uStack_59 = uStack_c9;
      dStack_58 = dStack_c8;
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_p != &local_b0) {
        operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_p != &local_e0) {
        operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
      }
      if ((pointer)local_110._0_8_ != pcVar1) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      if (bStack_5f == true) {
        do {
          Tokenizer::getToken((Token *)local_110,this->tokenizer);
          std::__cxx11::string::operator=((string *)local_a0,(string *)local_110);
          std::__cxx11::string::operator=((string *)&local_80,(string *)&local_f0);
          local_60 = local_d0;
          bStack_5f = bStack_cf;
          bStack_5e = bStack_ce;
          bStack_5d = bStack_cd;
          bStack_5c = bStack_cc;
          bStack_5b = bStack_cb;
          cStack_5a = cStack_ca;
          uStack_59 = uStack_c9;
          dStack_58 = dStack_c8;
          std::__cxx11::string::operator=((string *)&local_50,(string *)&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_p != &local_b0) {
            operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_p != &local_e0) {
            operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
          }
          if ((pointer)local_110._0_8_ != pcVar1) {
            operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
          }
        } while (bStack_5f != false);
      }
    } while (local_60 == false);
  }
  Tokenizer::ungetToken(this->tokenizer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != &local_70) {
    operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  return this_00;
}

Assistant:

Statements *Parser::fileInput() {
    // file_input: {NEWLINE | stmt}* ENDMARKER
    auto *stmts = new Statements();
//    auto *funcs = new Functions();
    Token tok = tokenizer.getToken();
    while(!tok.eof()) {
        while(tok.eol())
            tok = tokenizer.getToken();
        tokenizer.ungetToken();
        Statement *statement = stmt();
        if(tok.isDef()) {
            statement->isFunction = true;
            //_functions->addFunction(dynamic_cast<Function *>(statement));
        }
        stmts->addStatement(statement);

        tok = tokenizer.getToken();
        while (tok.eol())
            tok = tokenizer.getToken();
//        if(tok.isDedent()){
//            tokenizer.ungetToken();
//            return stmts;
//        }
//
//        if(tok.eol()){
//        //    return stmts;
//        }
        //tok = tokenizer.getToken();
        //if(tok.isDedent()) break;


    }
    tokenizer.ungetToken();
    return stmts;
}